

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_b10_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  uint8_t *puVar6;
  long lVar7;
  undefined1 in_XMM4 [16];
  undefined1 auVar8 [16];
  short sVar9;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar10 [16];
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint16_t uVar21;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  undefined1 auVar22 [16];
  uint16_t uVar29;
  
  auVar5 = _DAT_004c7fc0;
  puVar6 = mask + mask_stride;
  auVar8 = pmovsxbw(in_XMM4,0x4040404040404040);
  do {
    if (0 < w) {
      lVar7 = 0;
      do {
        puVar1 = mask + lVar7 * 2;
        puVar2 = puVar6 + lVar7 * 2;
        auVar18[0] = *puVar2 + *puVar1;
        auVar18[1] = puVar2[1] + puVar1[1];
        auVar18[2] = puVar2[2] + puVar1[2];
        auVar18[3] = puVar2[3] + puVar1[3];
        auVar18[4] = puVar2[4] + puVar1[4];
        auVar18[5] = puVar2[5] + puVar1[5];
        auVar18[6] = puVar2[6] + puVar1[6];
        auVar18[7] = puVar2[7] + puVar1[7];
        auVar18[8] = puVar2[8] + puVar1[8];
        auVar18[9] = puVar2[9] + puVar1[9];
        auVar18[10] = puVar2[10] + puVar1[10];
        auVar18[0xb] = puVar2[0xb] + puVar1[0xb];
        auVar18[0xc] = puVar2[0xc] + puVar1[0xc];
        auVar18[0xd] = puVar2[0xd] + puVar1[0xd];
        auVar18[0xe] = puVar2[0xe] + puVar1[0xe];
        auVar18[0xf] = puVar2[0xf] + puVar1[0xf];
        auVar10 = pshufb(auVar18,ZEXT816(0xe0c0a0806040200));
        auVar18 = pshufb(auVar18,ZEXT816(0xf0d0b0907050301));
        auVar22 = auVar18 & auVar10;
        auVar18 = auVar18 ^ auVar10;
        auVar19._0_2_ = auVar18._0_2_ >> 1;
        auVar19._2_2_ = auVar18._2_2_ >> 1;
        auVar19._4_2_ = auVar18._4_2_ >> 1;
        auVar19._6_2_ = auVar18._6_2_ >> 1;
        auVar19._8_2_ = auVar18._8_2_ >> 1;
        auVar19._10_2_ = auVar18._10_2_ >> 1;
        auVar19._12_2_ = auVar18._12_2_ >> 1;
        auVar19._14_2_ = auVar18._14_2_ >> 1;
        auVar19 = auVar19 & auVar5;
        auVar20[0] = auVar19[0] + auVar22[0];
        auVar20[1] = auVar19[1] + auVar22[1];
        auVar20[2] = auVar19[2] + auVar22[2];
        auVar20[3] = auVar19[3] + auVar22[3];
        auVar20[4] = auVar19[4] + auVar22[4];
        auVar20[5] = auVar19[5] + auVar22[5];
        auVar20[6] = auVar19[6] + auVar22[6];
        auVar20[7] = auVar19[7] + auVar22[7];
        auVar20[8] = auVar19[8] + auVar22[8];
        auVar20[9] = auVar19[9] + auVar22[9];
        auVar20[10] = auVar19[10] + auVar22[10];
        auVar20[0xb] = auVar19[0xb] + auVar22[0xb];
        auVar20[0xc] = auVar19[0xc] + auVar22[0xc];
        auVar20[0xd] = auVar19[0xd] + auVar22[0xd];
        auVar20[0xe] = auVar19[0xe] + auVar22[0xe];
        auVar20[0xf] = auVar19[0xf] + auVar22[0xf];
        auVar10 = pmovzxbw(auVar10,auVar20);
        sVar9 = pavgw(auVar10._0_2_,0);
        sVar11 = pavgw(auVar10._2_2_,0);
        sVar12 = pavgw(auVar10._4_2_,0);
        sVar13 = pavgw(auVar10._6_2_,0);
        sVar14 = pavgw(auVar10._8_2_,0);
        sVar15 = pavgw(auVar10._10_2_,0);
        sVar16 = pavgw(auVar10._12_2_,0);
        sVar17 = pavgw(auVar10._14_2_,0);
        puVar3 = src0 + lVar7;
        puVar4 = src1 + lVar7;
        uVar21 = pavgw((ushort)(*puVar3 * sVar9 + *puVar4 * (auVar8._0_2_ - sVar9)) >> 5,0);
        uVar23 = pavgw((ushort)(puVar3[1] * sVar11 + puVar4[1] * (auVar8._2_2_ - sVar11)) >> 5,0);
        uVar24 = pavgw((ushort)(puVar3[2] * sVar12 + puVar4[2] * (auVar8._4_2_ - sVar12)) >> 5,0);
        uVar25 = pavgw((ushort)(puVar3[3] * sVar13 + puVar4[3] * (auVar8._6_2_ - sVar13)) >> 5,0);
        uVar26 = pavgw((ushort)(puVar3[4] * sVar14 + puVar4[4] * (auVar8._8_2_ - sVar14)) >> 5,0);
        uVar27 = pavgw((ushort)(puVar3[5] * sVar15 + puVar4[5] * (auVar8._10_2_ - sVar15)) >> 5,0);
        uVar28 = pavgw((ushort)(puVar3[6] * sVar16 + puVar4[6] * (auVar8._12_2_ - sVar16)) >> 5,0);
        uVar29 = pavgw((ushort)(puVar3[7] * sVar17 + puVar4[7] * (auVar8._14_2_ - sVar17)) >> 5,0);
        puVar3 = dst + lVar7;
        *puVar3 = uVar21;
        puVar3[1] = uVar23;
        puVar3[2] = uVar24;
        puVar3[3] = uVar25;
        puVar3[4] = uVar26;
        puVar3[5] = uVar27;
        puVar3[6] = uVar28;
        puVar3[7] = uVar29;
        lVar7 = lVar7 + 8;
      } while ((int)lVar7 < w);
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    puVar6 = puVar6 + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                     src1_stride, mask, mask_stride, w, h,
                                     blend_8_b10);
}